

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

_Bool chck_buffer_read_string(char **str,size_t *len,chck_buffer *buf)

{
  byte local_9;
  
  if ((str != (char **)0x0) && (buf != (chck_buffer *)0x0)) {
    chck_buffer_read_string_cold_1();
    return (_Bool)(local_9 & 1);
  }
  __assert_fail("str && buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x151,"_Bool chck_buffer_read_string(char **, size_t *, struct chck_buffer *)");
}

Assistant:

bool
chck_buffer_read_string(char **str, size_t *len, struct chck_buffer *buf)
{
   assert(str && buf);
   *str = NULL;

   if (len)
      *len = 0;

   uint8_t bits;
   if (unlikely(!chck_buffer_read_int(&bits, sizeof(bits), buf)))
      return false;

   return likely(chck_buffer_read_string_of_type(str, len, bits, buf));
}